

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::setToDouble(DecimalQuantity *this,double n)

{
  setBcdToZero(this);
  this->flags = '\0';
  if ((long)n < 0) {
    this->flags = '\x01';
    n = (double)((ulong)n ^ (ulong)DAT_00331ab0);
  }
  if (NAN(n)) {
    this->flags = this->flags | 4;
  }
  else if ((ulong)ABS(n) < 0x7ff0000000000000) {
    if ((n != 0.0) || (NAN(n))) {
      _setToDoubleFast(this,n);
      compact(this);
    }
  }
  else {
    this->flags = this->flags | 2;
  }
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::setToDouble(double n) {
    setBcdToZero();
    flags = 0;
    // signbit() from <math.h> handles +0.0 vs -0.0
    if (std::signbit(n)) {
        flags |= NEGATIVE_FLAG;
        n = -n;
    }
    if (std::isnan(n) != 0) {
        flags |= NAN_FLAG;
    } else if (std::isfinite(n) == 0) {
        flags |= INFINITY_FLAG;
    } else if (n != 0) {
        _setToDoubleFast(n);
        compact();
    }
    return *this;
}